

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>_>::freeData
          (Span<QHashPrivate::Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>_> *this)

{
  long lVar1;
  
  if (this->entries != (Entry *)0x0) {
    lVar1 = 0;
    do {
      if (this->offsets[lVar1] != 0xff) {
        QPixmap::~QPixmap((QPixmap *)
                          ((this->entries->storage).data +
                          (ulong)((uint)this->offsets[lVar1] * 0x30) + 8));
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x80);
    if (this->entries != (Entry *)0x0) {
      operator_delete__(this->entries);
    }
    this->entries = (Entry *)0x0;
  }
  return;
}

Assistant:

void freeData() noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (entries) {
            if constexpr (!std::is_trivially_destructible<Node>::value) {
                for (auto o : offsets) {
                    if (o != SpanConstants::UnusedEntry)
                        entries[o].node().~Node();
                }
            }
            delete[] entries;
            entries = nullptr;
        }
    }